

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O0

int64_t CScriptNum::set_vch(vector<unsigned_char,_std::allocator<unsigned_char>_> *vch)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  byte *pbVar4;
  long in_FS_OFFSET;
  size_t i;
  int64_t result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb8;
  size_type in_stack_ffffffffffffffc0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc8;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    (in_stack_ffffffffffffffc8);
  if (bVar2) {
    local_10 = 0;
  }
  else {
    local_20 = 0;
    local_28 = 0;
    while( true ) {
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (in_stack_ffffffffffffffb8);
      if (local_28 == sVar3) break;
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      local_20 = (ulong)*pbVar4 << ((byte)(local_28 << 3) & 0x3f) | local_20;
      local_28 = local_28 + 1;
    }
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                       (in_stack_ffffffffffffffb8);
    if ((*pbVar4 & 0x80) == 0) {
      local_10 = local_20;
    }
    else {
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (in_stack_ffffffffffffffb8);
      local_10 = -(local_20 & (0x80L << (((char)sVar3 + -1) * '\b' & 0x3fU) ^ 0xffffffffffffffffU));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

static int64_t set_vch(const std::vector<unsigned char>& vch)
    {
      if (vch.empty())
          return 0;

      int64_t result = 0;
      for (size_t i = 0; i != vch.size(); ++i)
          result |= static_cast<int64_t>(vch[i]) << 8*i;

      // If the input vector's most significant byte is 0x80, remove it from
      // the result's msb and return a negative.
      if (vch.back() & 0x80)
          return -((int64_t)(result & ~(0x80ULL << (8 * (vch.size() - 1)))));

      return result;
    }